

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterferentGraphBuilder.cpp
# Opt level: O2

void addEdgesFromMoveLine
               (CodeLine *line,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *graph,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *ignoreList)

{
  __type _Var1;
  bool bVar2;
  MoveRegRegCommand *this;
  _Base_ptr p_Var3;
  string *this_00;
  string *b;
  string target;
  string source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> outTemp;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this = (MoveRegRegCommand *)
         __dynamic_cast((line->command).
                        super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,&AssemblyCode::AssemblyCommand::typeinfo,
                        &AssemblyCode::MoveRegRegCommand::typeinfo,0);
  AssemblyCode::MoveRegRegCommand::getTarget_abi_cxx11_(&local_110,this);
  AssemblyCode::MoveRegRegCommand::getSource_abi_cxx11_(&local_b0,this);
  p_Var3 = (line->liveOutTemps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(line->liveOutTemps)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_110);
      return;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)(p_Var3 + 1));
    _Var1 = std::operator==(&local_50,&local_b0);
    if (!_Var1) {
      bVar2 = isInIgnoreList(&local_50);
      if (!bVar2) {
        bVar2 = isInIgnoreList(&local_110);
        if (!bVar2) {
          std::__cxx11::string::string((string *)&local_f0,(string *)&local_50);
          bVar2 = isInDynamicIgnoreList(&local_f0,ignoreList);
          this_00 = &local_f0;
          if (!bVar2) {
            std::__cxx11::string::string((string *)&local_70,(string *)&local_110);
            bVar2 = isInDynamicIgnoreList(&local_70,ignoreList);
            this_00 = &local_f0;
            b = &local_70;
            if (!bVar2) {
              bVar2 = std::operator!=(&local_110,&local_50);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_f0);
              if (!bVar2) goto LAB_00147b81;
              std::__cxx11::string::string((string *)&local_d0,(string *)&local_110);
              std::__cxx11::string::string((string *)&local_90,(string *)&local_50);
              b = &local_90;
              AssemblyCode::addNotOrientedEdge(&local_d0,b,graph);
              this_00 = &local_d0;
            }
            std::__cxx11::string::~string((string *)b);
          }
          std::__cxx11::string::~string((string *)this_00);
        }
      }
    }
LAB_00147b81:
    std::__cxx11::string::~string((string *)&local_50);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

void addEdgesFromMoveLine(AssemblyCode::CodeLine& line, std::map<std::string, std::set<std::string>>& graph,
                          std::vector<std::string>& ignoreList) {
    AssemblyCode::MoveRegRegCommand* moveRegRegCommand =
            dynamic_cast<AssemblyCode::MoveRegRegCommand*>(line.command.get());

    std::string target = moveRegRegCommand->getTarget();
    std::string source = moveRegRegCommand->getSource();

    for (auto outTemp : line.liveOutTemps) {
        if (outTemp == source) {
            continue;
        }

        if (!isInIgnoreList(outTemp) && !isInIgnoreList(target) &&
                !isInDynamicIgnoreList(outTemp, ignoreList) && !isInDynamicIgnoreList(target, ignoreList) &&
                target != outTemp) {
            AssemblyCode::addNotOrientedEdge( target, outTemp, graph );
        }
    }
}